

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

void cf_h2_ctx_clear(cf_h2_ctx *ctx)

{
  Curl_easy *pCVar1;
  cf_call_data save;
  cf_h2_ctx *ctx_local;
  
  pCVar1 = (ctx->call_data).data;
  if (ctx->h2 != (nghttp2_session *)0x0) {
    nghttp2_session_del(ctx->h2);
  }
  Curl_bufq_free(&ctx->inbufq);
  Curl_bufq_free(&ctx->outbufq);
  Curl_bufcp_free(&ctx->stream_bufcp);
  memset(ctx,0,0xd0);
  (ctx->call_data).data = pCVar1;
  return;
}

Assistant:

static void cf_h2_ctx_clear(struct cf_h2_ctx *ctx)
{
  struct cf_call_data save = ctx->call_data;

  if(ctx->h2) {
    nghttp2_session_del(ctx->h2);
  }
  Curl_bufq_free(&ctx->inbufq);
  Curl_bufq_free(&ctx->outbufq);
  Curl_bufcp_free(&ctx->stream_bufcp);
  memset(ctx, 0, sizeof(*ctx));
  ctx->call_data = save;
}